

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O3

bool __thiscall
leveldb::FilterBlockReader::KeyMayMatch(FilterBlockReader *this,uint64_t block_offset,Slice *key)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined1 uVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  Slice filter;
  char *local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = block_offset >> ((byte)this->base_lg_ & 0x3f);
  if (uVar6 < this->num_) {
    pcVar3 = this->offset_;
    uVar1 = *(uint *)(pcVar3 + uVar6 * 4);
    uVar2 = *(uint *)(pcVar3 + uVar6 * 4 + 4);
    if (uVar1 <= uVar2) {
      if ((ulong)uVar2 <= (ulong)((long)pcVar3 - (long)this->data_)) {
        local_18 = this->data_ + uVar1;
        local_10 = (ulong)(uVar2 - uVar1);
        iVar5 = (*this->policy_->_vptr_FilterPolicy[4])(this->policy_,key,&local_18);
        uVar4 = (undefined1)iVar5;
        goto LAB_00d325fd;
      }
    }
    if (uVar1 == uVar2) {
      uVar4 = 0;
      goto LAB_00d325fd;
    }
  }
  uVar4 = 1;
LAB_00d325fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool FilterBlockReader::KeyMayMatch(uint64_t block_offset, const Slice& key) {
  uint64_t index = block_offset >> base_lg_;
  if (index < num_) {
    uint32_t start = DecodeFixed32(offset_ + index * 4);
    uint32_t limit = DecodeFixed32(offset_ + index * 4 + 4);
    if (start <= limit && limit <= static_cast<size_t>(offset_ - data_)) {
      Slice filter = Slice(data_ + start, limit - start);
      return policy_->KeyMayMatch(key, filter);
    } else if (start == limit) {
      // Empty filters do not match any keys
      return false;
    }
  }
  return true;  // Errors are treated as potential matches
}